

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::_::DebugComparison<kj::(anonymous_namespace)::Bar*,kj::(anonymous_namespace)::Bar*>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<kj::(anonymous_namespace)::Bar_*,_kj::(anonymous_namespace)::Bar_*>
          *params)

{
  Bar **value;
  CappedArray<char,_17UL> *in_R8;
  Array<char> local_88;
  CappedArray<char,_17UL> local_68;
  CappedArray<char,_17UL> local_48;
  
  toCharSequence<kj::(anonymous_namespace)::Bar*&>(&local_48,this,&params->left);
  toCharSequence<kj::(anonymous_namespace)::Bar*&>(&local_68,this + 8,value);
  _::concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            ((String *)&local_88,(_ *)&local_48,(CappedArray<char,_17UL> *)(this + 0x10),
             (StringPtr *)&local_68,in_R8);
  (__return_storage_ptr__->content).ptr = local_88.ptr;
  (__return_storage_ptr__->content).size_ = local_88.size_;
  (__return_storage_ptr__->content).disposer = local_88.disposer;
  local_88.ptr = (char *)0x0;
  local_88.size_ = 0;
  Array<char>::~Array(&local_88);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}